

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_spectral.cpp
# Opt level: O3

int AF_A_SpectralLightningTail
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  PClass *pPVar5;
  PClassActor *type;
  AActor *pAVar6;
  undefined8 *puVar7;
  char *__assertion;
  bool bVar8;
  DVector2 v;
  FName local_4c;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f1aeb;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar7 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar7 == (undefined8 *)0x0) {
LAB_005f196e:
        puVar7 = (undefined8 *)0x0;
      }
      else {
        pPVar5 = (PClass *)puVar7[1];
        if (pPVar5 == (PClass *)0x0) {
          pPVar5 = (PClass *)(**(code **)*puVar7)(puVar7);
          puVar7[1] = pPVar5;
        }
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f1aeb;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005f1a2e;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005f1adb;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar5;
            }
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar8) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar8 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar8) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005f1aeb;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005f1adb;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f1a2e:
        iVar4 = FName::NameManager::FindName(&FName::NameData,"SpectralLightningHTail",false);
        P_GetOffsetPosition((double)puVar7[9],(double)puVar7[10],-(double)puVar7[0x15],
                            -(double)puVar7[0x16]);
        local_48.Z = (double)puVar7[0xb] + 0.0;
        local_4c.Index = iVar4;
        type = ClassForSpawn(&local_4c);
        pAVar6 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
        (pAVar6->Angles).Yaw.Degrees = (double)puVar7[0x12];
        pAVar6->FriendPlayer = *(BYTE *)((long)puVar7 + 0x37e);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005f1aeb;
    }
    if (puVar7 == (undefined8 *)0x0) goto LAB_005f196e;
  }
LAB_005f1adb:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005f1aeb:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_spectral.cpp"
                ,0x1d,
                "int AF_A_SpectralLightningTail(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpectralLightningTail)
{
	PARAM_ACTION_PROLOGUE;

	AActor *foo = Spawn("SpectralLightningHTail", self->Vec3Offset(-self->Vel.X, -self->Vel.Y, 0.), ALLOW_REPLACE);

	foo->Angles.Yaw = self->Angles.Yaw;
	foo->FriendPlayer = self->FriendPlayer;
	return 0;
}